

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

void ym2413_set_mute_mask_emu(void *chip,UINT32 MuteMask)

{
  uint32_t *puVar1;
  long lVar2;
  
  *(undefined4 *)((long)chip + 0xe10) = 0;
  puVar1 = MUTE_MASK_MAP;
  lVar2 = 0;
  do {
    if ((MuteMask >> ((uint)lVar2 & 0x1f) & 1) != 0) {
      *(uint *)((long)chip + 0xe10) = *(uint *)((long)chip + 0xe10) | *puVar1;
    }
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 1;
  } while (lVar2 != 0xe);
  return;
}

Assistant:

static void ym2413_set_mute_mask_emu(void *chip, UINT32 MuteMask)
{
	EOPLL *opll = (EOPLL *)chip;
	uint8_t curChn;
	
	opll->mask = 0;
	for (curChn = 0; curChn < 14; curChn ++)
	{
		if ((MuteMask >> curChn) & 0x01)
			opll->mask |= MUTE_MASK_MAP[curChn];
	}
	
	return;
}